

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long *local_68 [2];
  long local_58 [2];
  void *local_48;
  long local_38;
  _InputArray local_28;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"w1","");
  cv::namedWindow((string *)local_68,1);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"w1","");
  cv::setMouseCallback((string *)local_68,click_callback,(void *)0x0);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Click on a spot with the left mouse button and hold down CTRL to add a point to the spline."
             ,0x5b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"w1","");
  local_28.sz.width = 0;
  local_28.sz.height = 0;
  local_28.flags = -0x7efeffeb;
  local_28.obj = &frame;
  cv::imshow((string *)local_68,&local_28);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  cv::waitKey(0);
  fit_and_draw_spline<HermiteSpline<3u,2u>>();
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  cv::waitKey(0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    namedWindow(WINDOW1, 1);
    setMouseCallback(WINDOW1, click_callback, NULL);

    cout << "Click on a spot with the left mouse button and hold down CTRL to add a point to the spline." << endl;

    imshow(WINDOW1, frame);
    waitKey(0);

    fit_and_draw_spline<CubicHermiteSpline<2>>();
    waitKey(0);

    return 0;
}